

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

IdentifierLookupResult *
anon_unknown.dwarf_ff84f::LookupObjectByName(ExpressionContext *ctx,uint nameHash)

{
  long *plVar1;
  Node *pNVar2;
  ScopeData *pSVar3;
  NodeIterator it;
  
  pSVar3 = (ScopeData *)&ctx->scope;
LAB_001e62a0:
  do {
    pSVar3 = pSVar3->scope;
    if (pSVar3 == (ScopeData *)0x0) {
      return (IdentifierLookupResult *)0x0;
    }
    it = DirectChainedMap<IdentifierLookupResult>::first(&pSVar3->idLookupMap,nameHash);
    pNVar2 = it.node;
  } while (pNVar2 == (Node *)0x0);
  if ((ctx->lookupLocation == (SynBase *)0x0) || (pSVar3->unrestricted != false)) {
LAB_001e6315:
    return (IdentifierLookupResult *)(pNVar2 + 8);
  }
  do {
    plVar1 = *(long **)(it.node + 8);
    do {
      pNVar2 = it.node;
      if (((plVar1 == (long *)0x0) || (plVar1[1] != 0)) ||
         (*(char **)(*plVar1 + 0x20) <= (ctx->lookupLocation->pos).begin)) {
        if (pNVar2 != (Node *)0x0) goto LAB_001e6315;
        goto LAB_001e62a0;
      }
      it = DirectChainedMap<IdentifierLookupResult>::next(&pSVar3->idLookupMap,it);
      plVar1 = (long *)0x0;
    } while (it.node == (Node *)0x0);
  } while( true );
}

Assistant:

IdentifierLookupResult* LookupObjectByName(ExpressionContext &ctx, unsigned nameHash)
	{
		typedef DirectChainedMap<IdentifierLookupResult>::NodeIterator Node;

		ScopeData *scope = ctx.scope;

		while(scope)
		{
			if(Node lookup = scope->idLookupMap.first(nameHash))
			{
				if(ctx.lookupLocation && !scope->unrestricted)
				{
					VariableData *variable = lookup.node->value.variable;

					// Skip variables that are not visible from current point
					while(variable && !variable->importModule && variable->source->pos.begin > ctx.lookupLocation->pos.begin)
					{
						lookup = scope->idLookupMap.next(lookup);

						if(lookup.node)
							variable = lookup.node->value.variable;
						else
							variable = NULL;
					}
				}

				if(lookup.node)
					return &lookup.node->value;;
			}

			scope = scope->scope;
		}

		return NULL;
	}